

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O3

intrusive_ptr<cppcms::impl::base_cache> __thiscall
cppcms::impl::process_cache_factory(impl *this,size_t memory,uint items)

{
  pointer this_00;
  basic_allocator<cppcms::impl::shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>_>
  local_19;
  
  process_settings::init((EVP_PKEY_CTX *)memory);
  this_00 = basic_allocator<cppcms::impl::shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>_>
            ::allocate(&local_19,1,(const_pointer)0x0);
  mem_cache<cppcms::impl::process_settings>::mem_cache(this_00,items);
  *(pointer *)this = this_00;
  (*(this_00->super_base_cache)._vptr_base_cache[6])(this_00);
  return (intrusive_ptr<cppcms::impl::base_cache>)(base_cache *)this;
}

Assistant:

booster::intrusive_ptr<base_cache> process_cache_factory(size_t memory,unsigned items)
{
	process_settings::init(memory);
	return new mem_cache<process_settings>(items);
}